

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_bits_enum(lys_ypr_ctx *pctx,lysc_type_bitenum_item *items,LY_DATA_TYPE basetype,
                   ly_bool *flag)

{
  char *pcVar1;
  uint local_5c;
  lysc_type_bitenum_item *local_50;
  ly_bool local_39;
  lysc_type_bitenum_item *plStack_38;
  ly_bool inner_flag;
  lysc_type_bitenum_item *item;
  uint64_t u;
  ly_bool *flag_local;
  lysc_type_bitenum_item *plStack_18;
  LY_DATA_TYPE basetype_local;
  lysc_type_bitenum_item *items_local;
  lys_ypr_ctx *pctx_local;
  
  u = (uint64_t)flag;
  flag_local._4_4_ = basetype;
  plStack_18 = items;
  items_local = (lysc_type_bitenum_item *)pctx;
  if ((basetype != LY_TYPE_BITS) && (basetype != LY_TYPE_ENUM)) {
    __assert_fail("(basetype == LY_TYPE_BITS) || (basetype == LY_TYPE_ENUM)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c"
                  ,0x32c,
                  "void yprc_bits_enum(struct lys_ypr_ctx *, const struct lysc_type_bitenum_item *, LY_DATA_TYPE, ly_bool *)"
                 );
  }
  item = (lysc_type_bitenum_item *)0x0;
  while( true ) {
    if (plStack_18 == (lysc_type_bitenum_item *)0x0) {
      local_50 = (lysc_type_bitenum_item *)0x0;
    }
    else {
      local_50 = *(lysc_type_bitenum_item **)&plStack_18[-1].field_4;
    }
    if (local_50 <= item) break;
    plStack_38 = plStack_18 + (long)item;
    local_39 = '\0';
    ypr_open((ly_out *)items_local->name,(ly_bool *)u);
    if (((ulong)items_local->dsc & 0x200000000) == 0) {
      local_5c = (uint)*(ushort *)&items_local->dsc << 1;
    }
    else {
      local_5c = 0;
    }
    pcVar1 = "enum";
    if (flag_local._4_4_ == LY_TYPE_BITS) {
      pcVar1 = "bit";
    }
    ly_print_((ly_out *)items_local->name,"%*s%s \"",(ulong)local_5c,"",pcVar1);
    ypr_encode((ly_out *)items_local->name,plStack_38->name,-1);
    ly_print_((ly_out *)items_local->name,"\"");
    *(short *)&items_local->dsc = *(short *)&items_local->dsc + 1;
    if (flag_local._4_4_ == LY_TYPE_BITS) {
      yprc_extension_instances
                ((lys_ypr_ctx *)items_local,LY_STMT_BIT,'\0',plStack_38->exts,&local_39);
      ypr_unsigned((lys_ypr_ctx *)items_local,LY_STMT_POSITION,'\0',plStack_38->exts,
                   (ulong)(plStack_38->field_4).position,&local_39);
    }
    else {
      yprc_extension_instances
                ((lys_ypr_ctx *)items_local,LY_STMT_ENUM,'\0',plStack_38->exts,&local_39);
      ypr_signed((lys_ypr_ctx *)items_local,LY_STMT_VALUE,'\0',plStack_38->exts,
                 (long)(plStack_38->field_4).value,&local_39);
    }
    ypr_status((lys_ypr_ctx *)items_local,plStack_38->flags,plStack_38->exts,&local_39);
    ypr_description((lys_ypr_ctx *)items_local,plStack_38->dsc,plStack_38->exts,&local_39);
    ypr_reference((lys_ypr_ctx *)items_local,plStack_38->ref,plStack_38->exts,&local_39);
    *(short *)&items_local->dsc = *(short *)&items_local->dsc + -1;
    ypr_close((lys_ypr_ctx *)items_local,local_39);
    item = (lysc_type_bitenum_item *)((long)&item->name + 1);
  }
  return;
}

Assistant:

static void
yprc_bits_enum(struct lys_ypr_ctx *pctx, const struct lysc_type_bitenum_item *items, LY_DATA_TYPE basetype, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    const struct lysc_type_bitenum_item *item;
    ly_bool inner_flag;

    assert((basetype == LY_TYPE_BITS) || (basetype == LY_TYPE_ENUM));

    LY_ARRAY_FOR(items, u) {
        item = &items[u];
        inner_flag = 0;

        ypr_open(pctx->out, flag);
        ly_print_(pctx->out, "%*s%s \"", INDENT, basetype == LY_TYPE_BITS ? "bit" : "enum");
        ypr_encode(pctx->out, item->name, -1);
        ly_print_(pctx->out, "\"");
        LEVEL++;
        if (basetype == LY_TYPE_BITS) {
            yprc_extension_instances(pctx, LY_STMT_BIT, 0, item->exts, &inner_flag);
            ypr_unsigned(pctx, LY_STMT_POSITION, 0, item->exts, item->position, &inner_flag);
        } else { /* LY_TYPE_ENUM */
            yprc_extension_instances(pctx, LY_STMT_ENUM, 0, item->exts, &inner_flag);
            ypr_signed(pctx, LY_STMT_VALUE, 0, item->exts, item->value, &inner_flag);
        }
        ypr_status(pctx, item->flags, item->exts, &inner_flag);
        ypr_description(pctx, item->dsc, item->exts, &inner_flag);
        ypr_reference(pctx, item->ref, item->exts, &inner_flag);
        LEVEL--;
        ypr_close(pctx, inner_flag);
    }
}